

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::compareEqual<std::basic_string_view<char,std::char_traits<char>>,char[11]>
               (basic_string_view<char,_std::char_traits<char>_> *lhs,char (*rhs) [11])

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_38;
  size_t local_28;
  char *local_20;
  char (*local_18) [11];
  char (*rhs_local) [11];
  basic_string_view<char,_std::char_traits<char>_> *lhs_local;
  
  local_28 = lhs->_M_len;
  local_20 = lhs->_M_str;
  local_18 = rhs;
  rhs_local = (char (*) [11])lhs;
  clara::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,*rhs);
  __x._M_str = local_20;
  __x._M_len = local_28;
  bVar1 = std::operator==(__x,local_38);
  return bVar1;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }